

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void gl4cts::EnhancedLayouts::Utils::Shader::Compile(Functions *gl,GLuint id)

{
  GLenum GVar1;
  CompilationException *this;
  GLint length;
  GLint status;
  string message;
  
  status = 0;
  (*gl->compileShader)(id);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"CompileShader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x8f6);
  (*gl->getShaderiv)(id,0x8b81,&status);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"GetShaderiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x8fa);
  if (status == 1) {
    return;
  }
  length = 0;
  message._M_dataplus._M_p = (pointer)&message.field_2;
  message._M_string_length = 0;
  message.field_2._M_local_buf[0] = '\0';
  (*gl->getShaderiv)(id,0x8b84,&length);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"GetShaderiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x904);
  std::__cxx11::string::resize((ulong)&message,(char)length);
  (*gl->getShaderInfoLog)(id,length,(GLsizei *)0x0,message._M_dataplus._M_p);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"GetShaderInfoLog",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x90b);
  this = (CompilationException *)__cxa_allocate_exception(0x28);
  CompilationException::CompilationException(this,message._M_dataplus._M_p);
  __cxa_throw(this,&CompilationException::typeinfo,CompilationException::~CompilationException);
}

Assistant:

void Shader::Compile(const Functions& gl, GLuint id)
{
	GLint status = GL_FALSE;

	/* Compile */
	gl.compileShader(id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "CompileShader");

	/* Get compilation status */
	gl.getShaderiv(id, GL_COMPILE_STATUS, &status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

	/* Log compilation error */
	if (GL_TRUE != status)
	{
		glw::GLint  length = 0;
		std::string message;

		/* Error log length */
		gl.getShaderiv(id, GL_INFO_LOG_LENGTH, &length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

		/* Prepare storage */
		message.resize(length, 0);

		/* Get error log */
		gl.getShaderInfoLog(id, length, 0, &message[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderInfoLog");

		throw CompilationException(message.c_str());
	}
}